

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_audio.c
# Opt level: O3

void glob_audio_properties(t_pd *dummy,t_floatarg flongform)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar12;
  undefined1 auVar11 [16];
  int noutdevs;
  uint local_89b8;
  uint local_89b4;
  ulong local_89b0;
  uint local_89a8;
  int cancallback;
  int canmulti;
  int nindevs;
  ulong local_8998;
  ulong local_8990;
  ulong local_8988;
  ulong local_8980;
  ulong local_8978;
  ulong local_8970;
  ulong local_8968;
  ulong local_8960;
  ulong local_8958;
  ulong local_8950;
  ulong local_8948;
  ulong local_8940;
  ulong local_8938;
  ulong local_8930;
  char srate [80];
  char blocksize [80];
  char callback [80];
  char *outdevs [128];
  char *indevs [128];
  char outdevlist [16384];
  char indevlist [16384];
  
  local_89b0 = CONCAT44(local_89b0._4_4_,flongform);
  nindevs = 0;
  noutdevs = 0;
  canmulti = 0;
  cancallback = 0;
  sys_get_audio_devs(indevlist,&nindevs,outdevlist,&noutdevs,&canmulti,&cancallback,0x80,0x80,
                     audio_nextsettings.a_api);
  lVar3 = (long)nindevs;
  if (0 < lVar3) {
    lVar5 = lVar3 + -1;
    auVar8._8_4_ = (int)lVar5;
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar8 = auVar8 ^ _DAT_001b53a0;
    auVar11 = _DAT_001b5390;
    do {
      auVar10 = auVar11 ^ _DAT_001b53a0;
      lVar12 = auVar11._8_8_;
      if ((bool)(~(auVar10._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar10._0_4_ ||
                  auVar8._4_4_ < auVar10._4_4_) & 1)) {
        *(char **)((long)indevs + lVar5) = indevlist + auVar11._0_8_ * 0x80;
      }
      if ((auVar10._12_4_ != auVar8._12_4_ || auVar10._8_4_ <= auVar8._8_4_) &&
          auVar10._12_4_ <= auVar8._12_4_) {
        *(char **)((long)indevs + lVar5 + 8) = indevlist + lVar12 * 0x80;
      }
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar12 + 2;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(nindevs + 1U >> 1) << 4 != lVar5);
  }
  if (0 < (long)noutdevs) {
    lVar5 = (long)noutdevs + -1;
    auVar9._8_4_ = (int)lVar5;
    auVar9._0_8_ = lVar5;
    auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar9 = auVar9 ^ _DAT_001b53a0;
    auVar10 = _DAT_001b5390;
    do {
      auVar11 = auVar10 ^ _DAT_001b53a0;
      lVar12 = auVar10._8_8_;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        *(char **)((long)outdevs + lVar5) = outdevlist + auVar10._0_8_ * 0x80;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        *(char **)((long)outdevs + lVar5 + 8) = outdevlist + lVar12 * 0x80;
      }
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar12 + 2;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(noutdevs + 1U >> 1) << 4 != lVar5);
  }
  if (nindevs == 0) {
    nindevs = 1;
    indevs[0] = "";
    lVar3 = 1;
  }
  if (noutdevs == 0) {
    noutdevs = 1;
    outdevs[0] = "";
  }
  pdgui_vmess("set","rS","::audio_indevlist",lVar3,indevs);
  pdgui_vmess("set","rS","::audio_outdevlist",(ulong)(uint)noutdevs,outdevs);
  iVar2 = audio_nextsettings.a_callback;
  if (initted == '\x01') {
    local_89b4 = audio_nextsettings.a_indevvec[0];
    local_8980 = (ulong)audio_nextsettings._24_8_ >> 0x20;
    local_8988 = (ulong)audio_nextsettings._44_8_ >> 0x20;
    local_8990 = (ulong)audio_nextsettings._64_8_ >> 0x20;
    uVar4 = audio_nextsettings._84_8_ & 0xffffffff;
    local_8998 = (ulong)audio_nextsettings._84_8_ >> 0x20;
    local_89b8 = audio_nextsettings.a_blocksize;
    bVar7 = 1 < audio_nextsettings.a_noutdev || 1 < audio_nextsettings.a_nindev;
  }
  else {
    audio_nextsettings.a_api = 9;
    audio_nextsettings.a_nindev = 1;
    audio_nextsettings.a_srate = 0xac44;
    audio_nextsettings.a_advance = 0x19;
    audio_nextsettings.a_nchoutdev = 1;
    audio_nextsettings.a_choutdevvec[0] = 2;
    audio_nextsettings.a_noutdev = 1;
    audio_nextsettings.a_outdevvec[0] = 0;
    audio_nextsettings.a_nchindev = 1;
    audio_nextsettings.a_chindevvec[0] = 2;
    initted = '\x01';
    local_8990 = 2;
    uVar4 = 0xac44;
    local_8998 = 0x19;
    local_89b8 = 0x40;
    local_8980 = 2;
    local_89b4 = 0;
    bVar7 = false;
    local_8988 = 0;
  }
  local_89a8 = audio_nextsettings.a_indevvec[1];
  local_8930 = (ulong)(uint)audio_nextsettings.a_indevvec[3];
  local_8938 = (ulong)(uint)audio_nextsettings.a_chindevvec[1];
  local_8940 = (ulong)(uint)audio_nextsettings.a_chindevvec[2];
  local_8948 = (ulong)(uint)audio_nextsettings.a_chindevvec[3];
  local_8950 = (ulong)(uint)audio_nextsettings.a_outdevvec[1];
  local_8958 = (ulong)(uint)audio_nextsettings.a_outdevvec[2];
  local_8960 = (ulong)(uint)audio_nextsettings.a_outdevvec[3];
  local_8968 = (ulong)(uint)audio_nextsettings.a_choutdevvec[1];
  local_8970 = (ulong)(uint)audio_nextsettings.a_choutdevvec[2];
  local_8978 = (ulong)(uint)audio_nextsettings.a_choutdevvec[3];
  bVar1 = (float)local_89b0 != 0.0;
  audio_nextsettings.a_indevvec[0] = local_89b4;
  audio_nextsettings.a_blocksize = local_89b8;
  local_89b0 = (ulong)(uint)audio_nextsettings.a_indevvec[2];
  sprintf(srate,"%s%d","",uVar4);
  pcVar6 = "!";
  if (cancallback != 0) {
    pcVar6 = "";
  }
  sprintf(callback,"%s%d",pcVar6,(ulong)(uint)iVar2);
  sprintf(blocksize,"%s%d","",(ulong)local_89b8);
  pdgui_stub_deleteforkey((void *)0x0);
  pdgui_stub_vnew(&glob_pdobject,"pdtk_audio_dialog",glob_audio_properties,
                  "iiii iiii iiii iiii  s ii s i s",(ulong)local_89b4,(ulong)local_89a8,local_89b0,
                  local_8930,local_8980,local_8938,local_8940,local_8948,local_8988,local_8950,
                  local_8958,local_8960,local_8990,local_8968,local_8970,local_8978,srate,local_8998
                  ,(ulong)(uint)canmulti,callback,(ulong)(byte)(bVar1 | bVar7),blocksize);
  return;
}

Assistant:

void glob_audio_properties(t_pd *dummy, t_floatarg flongform)
{
    t_audiosettings as;
        /* these are all the devices on your system: */
    char indevlist[MAXNDEV*DEVDESCSIZE], outdevlist[MAXNDEV*DEVDESCSIZE];
    char device[MAXPDSTRING];
    char *indevs[MAXNDEV], *outdevs[MAXNDEV];
    int nindevs = 0, noutdevs = 0, canmulti = 0, cancallback = 0, i;
    char srate[80], callback[80], blocksize[80];

    sys_get_audio_devs(indevlist, &nindevs, outdevlist, &noutdevs, &canmulti,
         &cancallback, MAXNDEV, DEVDESCSIZE, audio_nextsettings.a_api);

    for (i = 0; i < nindevs; i++)
        indevs[i] = indevlist + i * DEVDESCSIZE;
    for (i = 0; i < noutdevs; i++)
        outdevs[i] = outdevlist + i * DEVDESCSIZE;

    if(!nindevs) {
        nindevs = 1;
        indevs[0] = "";
    }
    if(!noutdevs) {
        noutdevs = 1;
        outdevs[0] = "";
    }

    pdgui_vmess("set", "rS",
            "::audio_indevlist",
            nindevs, indevs);
    pdgui_vmess("set", "rS",
            "::audio_outdevlist",
            noutdevs, outdevs);

    sys_get_audio_settings(&as);

    if (as.a_nindev > 1 || as.a_noutdev > 1)
        flongform = 1;

    sprintf(srate, "%s%d", audio_isfixedsr(as.a_api)?"!":"", as.a_srate);
    sprintf(callback, "%s%d", cancallback?"":"!", as.a_callback);
    sprintf(blocksize, "%s%d", audio_isfixedblocksize(as.a_api)?"!":"", as.a_blocksize);

        /* values that are fixed and must not be changed by the GUI are
        prefixed with '!';  * the GUI will then display these values but
        disable their widgets */
    pdgui_stub_deleteforkey(0);
    pdgui_stub_vnew(&glob_pdobject,
        "pdtk_audio_dialog", (void *)glob_audio_properties,
        "iiii iiii iiii iiii  s ii s i s",
        as.a_indevvec   [0], as.a_indevvec   [1], as.a_indevvec   [2], as.a_indevvec   [3],
        as.a_chindevvec [0], as.a_chindevvec [1], as.a_chindevvec [2], as.a_chindevvec [3],
        as.a_outdevvec  [0], as.a_outdevvec  [1], as.a_outdevvec  [2], as.a_outdevvec  [3],
        as.a_choutdevvec[0], as.a_choutdevvec[1], as.a_choutdevvec[2], as.a_choutdevvec[3],
        srate,
        as.a_advance, canmulti,
        callback,
        (flongform != 0),
        blocksize);
}